

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O1

void __thiscall FlickerRemover::clear(FlickerRemover *this)

{
  uint uVar1;
  uint uVar2;
  UMat **ppUVar3;
  uint uVar4;
  UMat *pUVar5;
  
  uVar1 = (this->corresponding_frames_similarity_levels).count_of_elements;
  pUVar5 = (UMat *)0x0;
  if (uVar1 != 0) {
    ppUVar3 = (this->corresponding_frames_similarity_levels).data;
    uVar2 = (this->corresponding_frames_similarity_levels).first_element_index;
    pUVar5 = ppUVar3[uVar2];
    ppUVar3[uVar2] = (UMat *)0x0;
    uVar4 = uVar2 + 1;
    if (uVar2 == (this->corresponding_frames_similarity_levels).count_of_slots - 1) {
      uVar4 = 0;
    }
    (this->corresponding_frames_similarity_levels).first_element_index = uVar4;
    (this->corresponding_frames_similarity_levels).count_of_elements = uVar1 - 1;
  }
  while (pUVar5 != (UMat *)0x0) {
    cv::UMat::~UMat(pUVar5);
    operator_delete(pUVar5,0x50);
    uVar1 = (this->corresponding_frames_similarity_levels).count_of_elements;
    if (uVar1 == 0) {
      pUVar5 = (UMat *)0x0;
    }
    else {
      ppUVar3 = (this->corresponding_frames_similarity_levels).data;
      uVar2 = (this->corresponding_frames_similarity_levels).first_element_index;
      pUVar5 = ppUVar3[uVar2];
      ppUVar3[uVar2] = (UMat *)0x0;
      uVar4 = uVar2 + 1;
      if (uVar2 == (this->corresponding_frames_similarity_levels).count_of_slots - 1) {
        uVar4 = 0;
      }
      (this->corresponding_frames_similarity_levels).first_element_index = uVar4;
      (this->corresponding_frames_similarity_levels).count_of_elements = uVar1 - 1;
    }
  }
  uVar1 = (this->adjacent_frames_similarity_levels).count_of_elements;
  pUVar5 = (UMat *)0x0;
  if (uVar1 != 0) {
    ppUVar3 = (this->adjacent_frames_similarity_levels).data;
    uVar2 = (this->adjacent_frames_similarity_levels).first_element_index;
    pUVar5 = ppUVar3[uVar2];
    ppUVar3[uVar2] = (UMat *)0x0;
    uVar4 = uVar2 + 1;
    if (uVar2 == (this->adjacent_frames_similarity_levels).count_of_slots - 1) {
      uVar4 = 0;
    }
    (this->adjacent_frames_similarity_levels).first_element_index = uVar4;
    (this->adjacent_frames_similarity_levels).count_of_elements = uVar1 - 1;
  }
  while (pUVar5 != (UMat *)0x0) {
    cv::UMat::~UMat(pUVar5);
    operator_delete(pUVar5,0x50);
    uVar1 = (this->adjacent_frames_similarity_levels).count_of_elements;
    if (uVar1 == 0) {
      pUVar5 = (UMat *)0x0;
    }
    else {
      ppUVar3 = (this->adjacent_frames_similarity_levels).data;
      uVar2 = (this->adjacent_frames_similarity_levels).first_element_index;
      pUVar5 = ppUVar3[uVar2];
      ppUVar3[uVar2] = (UMat *)0x0;
      uVar4 = uVar2 + 1;
      if (uVar2 == (this->adjacent_frames_similarity_levels).count_of_slots - 1) {
        uVar4 = 0;
      }
      (this->adjacent_frames_similarity_levels).first_element_index = uVar4;
      (this->adjacent_frames_similarity_levels).count_of_elements = uVar1 - 1;
    }
  }
  return;
}

Assistant:

void FlickerRemover::clear() {
    auto to_delete_1 = corresponding_frames_similarity_levels.pop();
    while(to_delete_1 != nullptr) {
        delete to_delete_1;
        to_delete_1 = corresponding_frames_similarity_levels.pop();
    }
    auto to_delete_2 = adjacent_frames_similarity_levels.pop();
    while(to_delete_2 != nullptr) {
        delete to_delete_2;
        to_delete_2 = adjacent_frames_similarity_levels.pop();
    }
}